

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O2

int __thiscall deqp::gls::RandomShaderCase::init(RandomShaderCase *this,EVP_PKEY_CTX *ctx)

{
  Shader *vertexShader;
  Shader *fragmentShader;
  vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_> *this_00;
  pointer *ppfVar1;
  uint uVar2;
  undefined4 uVar3;
  ShaderInput *input;
  Variable *pVVar4;
  pointer pSVar5;
  pointer pSVar6;
  undefined4 uVar8;
  pointer puVar7;
  ulong uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  pointer pfVar14;
  bool bVar15;
  int extraout_EAX;
  Texture2D *tex2D;
  TextureCube *texCube;
  TestError *this_01;
  uint uVar16;
  pointer pVVar17;
  pointer ppSVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  unsigned_short uVar22;
  unsigned_short uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ConstStridedValueAccess<1> CVar31;
  ProgramGenerator programGenerator;
  allocator<char> local_141;
  TextureManager *local_140;
  RandomShaderCase *local_138;
  uint local_12c;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> unifiedUniforms;
  VertexArray vtxArray;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  Random rnd;
  
  rsg::ProgramGenerator::ProgramGenerator(&programGenerator);
  vertexShader = &this->m_vertexShader;
  fragmentShader = &this->m_fragmentShader;
  rsg::ProgramGenerator::generate(&programGenerator,&this->m_parameters,vertexShader,fragmentShader)
  ;
  checkShaderLimits(this,vertexShader);
  checkShaderLimits(this,fragmentShader);
  checkProgramLimits(this,vertexShader,fragmentShader);
  unifiedUniforms.
  super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unifiedUniforms.
  super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unifiedUniforms.
  super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,(this->m_parameters).seed);
  rsg::computeUnifiedUniforms(vertexShader,fragmentShader,&unifiedUniforms);
  rsg::computeUniformValues(&rnd,&this->m_uniforms,&unifiedUniforms);
  local_12c = (this->m_gridHeight + 1) * (this->m_gridWidth + 1);
  ppSVar18 = (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar16 = 0;
  if (0 < (int)local_12c) {
    uVar16 = local_12c;
  }
  this_00 = &this->m_vertexArrays;
  local_138 = this;
  while( true ) {
    if (ppSVar18 ==
        (this->m_vertexShader).m_inputs.
        super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar16 = this->m_gridHeight * this->m_gridWidth;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&this->m_indices,(long)(int)(uVar16 * 6));
      iVar19 = this->m_gridWidth;
      sVar13 = (short)iVar19 + 1;
      puVar7 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = 0;
      uVar24 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar24 = uVar20;
      }
      for (uVar25 = 0; uVar24 != uVar25; uVar25 = uVar25 + 1) {
        uVar9 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
        sVar12 = (short)((long)uVar9 / (long)iVar19);
        sVar11 = sVar12 * sVar13;
        sVar10 = (short)((long)uVar9 % (long)iVar19);
        iVar21 = (int)uVar20;
        puVar7[iVar21] = sVar10 + sVar11;
        sVar12 = (sVar12 + 1) * sVar13;
        uVar23 = sVar10 + sVar12;
        puVar7[iVar21 + 1] = uVar23;
        uVar22 = sVar10 + 1 + sVar11;
        puVar7[iVar21 + 2] = uVar22;
        puVar7[iVar21 + 3] = uVar22;
        puVar7[iVar21 + 4] = uVar23;
        puVar7[iVar21 + 5] = sVar10 + 1 + sVar12;
        uVar20 = (ulong)(iVar21 + 6);
      }
      ppfVar1 = &vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_140 = &this->m_texManager;
      for (pVVar17 = (this->m_uniforms).
                     super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pVVar17 !=
          (this->m_uniforms).
          super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
          super__Vector_impl_data._M_finish; pVVar17 = pVVar17 + 1) {
        pVVar4 = pVVar17->m_variable;
        if (((pVVar4->m_type).m_baseType & ~TYPE_FLOAT) == TYPE_SAMPLER_2D) {
          iVar19 = ((pVVar17->m_storage).m_value.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_start)->intVal;
          vtxArray.m_input = (ShaderInput *)0x6;
          vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppfVar1;
          bVar15 = rsg::VariableType::operator==(&pVVar4->m_type,(VariableType *)&vtxArray);
          rsg::VariableType::~VariableType((VariableType *)&vtxArray);
          this = local_138;
          if (bVar15) {
            tex2D = getTex2D(local_138);
            TextureManager::bindTexture(local_140,iVar19,tex2D);
          }
          else {
            vtxArray.m_input = (ShaderInput *)0x7;
            vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppfVar1;
            bVar15 = rsg::VariableType::operator==(&pVVar4->m_type,(VariableType *)&vtxArray);
            this = local_138;
            rsg::VariableType::~VariableType((VariableType *)&vtxArray);
            if (bVar15) {
              texCube = getTexCube(this);
              TextureManager::bindTexture(local_140,iVar19,texCube);
            }
          }
        }
      }
      std::_Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::
      ~_Vector_base(&unifiedUniforms.
                     super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                   );
      rsg::ProgramGenerator::~ProgramGenerator(&programGenerator);
      return extraout_EAX;
    }
    input = *ppSVar18;
    pVVar4 = input->m_variable;
    pSVar5 = (input->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar6 = (input->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (pVVar4->m_type).m_numElements;
    VertexArray::VertexArray(&vtxArray,input,local_12c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,(input->m_variable->m_name)._M_dataplus._M_p,&local_141);
    bVar15 = std::operator==(&local_88,"dEQP_Position");
    std::__cxx11::string::~string((string *)&local_88);
    if ((input->m_variable->m_type).m_baseType != TYPE_FLOAT) break;
    iVar19 = 0;
    uVar24 = 0;
    if (0 < (int)uVar2) {
      uVar24 = (ulong)uVar2;
    }
    for (uVar20 = 0;
        pfVar14 = vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start, uVar20 != uVar16; uVar20 = uVar20 + 1) {
      uVar3 = this->m_gridWidth;
      uVar8 = this->m_gridHeight;
      uVar25 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
      auVar28._0_4_ = (float)(int)((long)uVar25 % (long)(uVar3 + 1));
      auVar28._4_4_ = (float)(int)((long)uVar25 / (long)(uVar3 + 1));
      auVar28._8_8_ = 0;
      auVar29._0_4_ = (float)(int)uVar3;
      auVar29._4_4_ = (float)(int)uVar8;
      auVar29._8_8_ = 0;
      auVar29 = divps(auVar28,auVar29);
      if (bVar15) {
        auVar30._0_4_ = auVar29._0_4_ * 2.0 + -1.0;
        auVar30._4_4_ = auVar29._4_4_ * -2.0 + 1.0;
        auVar30._8_8_ = 0x3f80000000000000;
        *(undefined1 (*) [16])
         (vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start + (int)(uVar2 * (int)uVar20)) = auVar30;
      }
      else {
        local_68 = 1.0 - auVar29._0_4_;
        fStack_64 = 1.0 - auVar29._4_4_;
        fStack_60 = 0.0 - auVar29._8_4_;
        fStack_5c = 0.0 - auVar29._12_4_;
        local_58 = auVar29;
        for (uVar25 = 0; uVar24 != uVar25; uVar25 = uVar25 + 1) {
          local_88._M_dataplus._M_p = (pointer)pVVar4;
          local_88._M_string_length = (size_type)pSVar5;
          CVar31 = rsg::ConstStridedValueAccess<1>::component
                             ((ConstStridedValueAccess<1> *)&local_88,(int)uVar25);
          local_140 = (TextureManager *)CONCAT44(local_140._4_4_,(CVar31.m_value)->intVal);
          local_88._M_dataplus._M_p = (pointer)pVVar4;
          local_88._M_string_length = (size_type)pSVar6;
          CVar31 = rsg::ConstStridedValueAccess<1>::component
                             ((ConstStridedValueAccess<1> *)&local_88,(int)uVar25);
          uVar26 = -(uint)((uVar25 & 2) == 0);
          uVar27 = -(uint)((uVar25 & 1) == 0);
          pfVar14[(long)iVar19 + uVar25] =
               ((CVar31.m_value)->floatVal - local_140._0_4_) *
               ((float)(~uVar27 & (uint)fStack_64 | local_58._4_4_ & uVar27) +
               (float)(~uVar26 & (uint)local_68 | local_58._0_4_ & uVar26)) * 0.5 + local_140._0_4_;
        }
      }
      iVar19 = iVar19 + uVar2;
      this = local_138;
    }
    std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::push_back
              (this_00,&vtxArray);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&vtxArray.m_vertices.super__Vector_base<float,_std::allocator<float>_>);
    ppSVar18 = ppSVar18 + 1;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,
             "input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
             ,0xa5);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RandomShaderCase::init (void)
{
	// Generate shaders
	rsg::ProgramGenerator programGenerator;
	programGenerator.generate(m_parameters, m_vertexShader, m_fragmentShader);

	checkShaderLimits(m_vertexShader);
	checkShaderLimits(m_fragmentShader);
	checkProgramLimits(m_vertexShader, m_fragmentShader);

	// Compute uniform values
	std::vector<const rsg::ShaderInput*>	unifiedUniforms;
	de::Random								rnd(m_parameters.seed);
	rsg::computeUnifiedUniforms(m_vertexShader, m_fragmentShader, unifiedUniforms);
	rsg::computeUniformValues(rnd, m_uniforms, unifiedUniforms);

	// Generate vertices
	const vector<rsg::ShaderInput*>&	inputs		= m_vertexShader.getInputs();
	int									numVertices	= (m_gridWidth+1)*(m_gridHeight+1);

	for (vector<rsg::ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
	{
		const rsg::ShaderInput*			input			= *i;
		rsg::ConstValueRangeAccess		valueRange		= input->getValueRange();
		int								numComponents	= input->getVariable()->getType().getNumElements();
		VertexArray						vtxArray(input, numVertices);
		bool							isPosition		= string(input->getVariable()->getName()) == "dEQP_Position";

		TCU_CHECK(input->getVariable()->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx++)
		{
			int		y	= vtxNdx / (m_gridWidth+1);
			int		x	= vtxNdx - y*(m_gridWidth+1);
			float	xf	= (float)x / (float)m_gridWidth;
			float	yf	= (float)y / (float)m_gridHeight;
			float*	dst	= &vtxArray.getVertices()[vtxNdx*numComponents];

			if (isPosition)
			{
				// Position attribute gets special interpolation handling.
				DE_ASSERT(numComponents == 4);
				dst[0] = -1.0f + xf *  2.0f;
				dst[1] =  1.0f + yf * -2.0f;
				dst[2] = 0.0f;
				dst[3] = 1.0f;
			}
			else
			{
				for (int compNdx = 0; compNdx < numComponents; compNdx++)
				{
					float	minVal	= valueRange.getMin().component(compNdx).asFloat();
					float	maxVal	= valueRange.getMax().component(compNdx).asFloat();
					float	xd, yd;

					rsg::getVertexInterpolationCoords(xd, yd, xf, yf, compNdx);

					float	f		= (xd+yd) / 2.0f;

					dst[compNdx] = minVal + f * (maxVal-minVal);
				}
			}
		}

		m_vertexArrays.push_back(vtxArray);
	}

	// Generate indices
	int numQuads	= m_gridWidth*m_gridHeight;
	int numIndices	= numQuads*6;
	m_indices.resize(numIndices);
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (m_gridWidth);
		int quadX	= quadNdx - quadY*m_gridWidth;

		m_indices[quadNdx*6+0] = (deUint16)(quadX + quadY*(m_gridWidth+1));
		m_indices[quadNdx*6+1] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1));
		m_indices[quadNdx*6+2] = (deUint16)(quadX + quadY*(m_gridWidth+1) + 1);
		m_indices[quadNdx*6+3] = (deUint16)(m_indices[quadNdx*6+2]);
		m_indices[quadNdx*6+4] = (deUint16)(m_indices[quadNdx*6+1]);
		m_indices[quadNdx*6+5] = (deUint16)(quadX + (quadY+1)*(m_gridWidth+1) + 1);
	}

	// Create textures.
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		const rsg::VariableType& type = uniformIter->getVariable()->getType();

		if (!type.isSampler())
			continue;

		int unitNdx = uniformIter->getValue().asInt(0);

		if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_2D, 1))
			m_texManager.bindTexture(unitNdx, getTex2D());
		else if (type == rsg::VariableType(rsg::VariableType::TYPE_SAMPLER_CUBE, 1))
			m_texManager.bindTexture(unitNdx, getTexCube());
		else
			DE_ASSERT(DE_FALSE);
	}
}